

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

int Vec_IntCountNonTrivial(Vec_Ptr_t *vEquivs,int *pnUsed)

{
  int iVar1;
  void **ppvVar2;
  int iVar3;
  long lVar4;
  
  *pnUsed = 0;
  if (0 < vEquivs->nSize) {
    ppvVar2 = vEquivs->pArray;
    lVar4 = 0;
    iVar3 = 0;
    do {
      iVar1 = *(int *)((long)ppvVar2[lVar4] + 4);
      if (1 < iVar1) {
        iVar3 = iVar3 + 1;
        *pnUsed = *pnUsed + iVar1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < vEquivs->nSize);
    return iVar3;
  }
  return 0;
}

Assistant:

int Vec_IntCountNonTrivial( Vec_Ptr_t * vEquivs, int * pnUsed )
{
    Vec_Int_t * vClass;
    int i, nClasses = 0;
    *pnUsed = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vEquivs, vClass, i )
    {
        if ( Vec_IntSize(vClass) < 2 )
            continue;
        nClasses++;
        (*pnUsed) += Vec_IntSize(vClass);
    }
    return nClasses;
}